

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O0

void mkmap(level *lev,lev_init *init_lev)

{
  char bg_typ_00;
  schar fg_typ_00;
  char cVar1;
  char cVar2;
  char walled_00;
  schar sVar3;
  int iVar4;
  int local_24;
  boolean local_1d;
  int i;
  xchar walled;
  xchar lit;
  boolean join;
  boolean smooth;
  schar fg_typ;
  schar bg_typ;
  lev_init *init_lev_local;
  level *lev_local;
  
  bg_typ_00 = init_lev->bg;
  fg_typ_00 = init_lev->fg;
  cVar1 = init_lev->smoothed;
  cVar2 = init_lev->joined;
  local_1d = init_lev->lit;
  walled_00 = init_lev->walled;
  if (local_1d < '\0') {
    sVar3 = depth(&u.uz);
    iVar4 = (int)sVar3;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    iVar4 = rnd(iVar4 + 1);
    local_1d = '\0';
    if (iVar4 < 0xb) {
      iVar4 = rn2(0x4d);
      local_1d = iVar4 != 0;
    }
  }
  new_locations = (char *)malloc(0x62c);
  if (bg_typ_00 < '\'') {
    init_map(lev,bg_typ_00);
  }
  init_fill(lev,bg_typ_00,fg_typ_00);
  for (local_24 = 0; local_24 < 1; local_24 = local_24 + 1) {
    pass_one(lev,bg_typ_00,fg_typ_00);
  }
  for (local_24 = 0; local_24 < 1; local_24 = local_24 + 1) {
    pass_two(lev,bg_typ_00,fg_typ_00);
  }
  if (cVar1 != '\0') {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      pass_three(lev,bg_typ_00,fg_typ_00);
    }
  }
  if (cVar2 != '\0') {
    join_map(lev,bg_typ_00,fg_typ_00);
  }
  finish_map(lev,fg_typ_00,bg_typ_00,local_1d,walled_00);
  if (((walled_00 != '\0') && (cVar2 != '\0')) && (-1 < init_lev->filling)) {
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffdffff;
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfff7ffff | 0x80000;
    backfill(lev,bg_typ_00,init_lev->filling);
  }
  free(new_locations);
  return;
}

Assistant:

void mkmap(struct level *lev, lev_init *init_lev)
{
	schar	bg_typ = init_lev->bg,
		fg_typ = init_lev->fg;
	boolean smooth = init_lev->smoothed,
		join = init_lev->joined;
	xchar   lit = init_lev->lit,
		walled = init_lev->walled;
	int i;

	if (lit < 0)
	    lit = (rnd(1+abs(depth(&u.uz))) < 11 && rn2(77)) ? 1 : 0;

	new_locations = malloc((WIDTH+1) * HEIGHT);

	if (bg_typ < MAX_TYPE)
	    init_map(lev, bg_typ);
	init_fill(lev, bg_typ, fg_typ);

	for (i = 0; i < N_P1_ITER; i++)
	    pass_one(lev, bg_typ, fg_typ);

	for (i = 0; i < N_P2_ITER; i++)
	    pass_two(lev, bg_typ, fg_typ);

	if (smooth)
	    for (i = 0; i < N_P3_ITER; i++)
		pass_three(lev, bg_typ, fg_typ);

	if (join)
	    join_map(lev, bg_typ, fg_typ);

	finish_map(lev, fg_typ, bg_typ, (boolean)lit, (boolean)walled);
	/* a walled, joined level is cavernous, not mazelike -dlc
	 *
	 * also, caverns have a defined "inside" and "outside"; the outside
	 * doesn't _have_ to be stone, say, for hell.  so if the player
	 * defined a maze filler originally, go ahead and backfill the
	 * background in with that filler - DSR */
	if (walled && join && init_lev->filling > -1) {
	    lev->flags.is_maze_lev = FALSE;
	    lev->flags.is_cavernous_lev = TRUE;
	    backfill(lev, bg_typ, init_lev->filling);
	}
	free(new_locations);
}